

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_moveout_ppc(uc_struct_conflict10 *uc,MemoryRegion *mr)

{
  uint uVar1;
  MemoryRegion **ppMVar2;
  long lVar3;
  hwaddr hVar4;
  MemoryRegion *pMVar5;
  MemoryRegion *local_20;
  
  pMVar5 = (mr->subregions).tqh_first;
  if ((mr->subregions).tqh_first == (MemoryRegion *)0x0) {
    pMVar5 = mr;
  }
  local_20 = mr;
  if (uc->cpu != (CPUState_conflict *)0x0) {
    if (*(long *)((long)&mr->size + 8) != 0) {
      __assert_fail("r == a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                    ,0x16,"uint64_t int128_get64(Int128)");
    }
    (*uc->uc_invalidate_tb)(uc,mr->addr,(size_t)mr->size);
    for (hVar4 = local_20->addr; local_20->end != hVar4 && -1 < (long)(local_20->end - hVar4);
        hVar4 = hVar4 + uc->target_page_size) {
      tlb_flush_page_ppc(uc->cpu,(target_ulong_conflict)hVar4);
    }
  }
  memory_region_del_subregion_ppc(uc->system_memory,local_20);
  g_array_append_vals(uc->unmapped_regions,&local_20,1);
  uVar1 = uc->mapped_block_count;
  if ((ulong)uVar1 != 0) {
    ppMVar2 = uc->mapped_blocks;
    lVar3 = 0;
    do {
      if (*(MemoryRegion **)((long)ppMVar2 + lVar3) == pMVar5) {
        uc->mapped_block_count = uVar1 - 1;
        memmove((void *)((long)ppMVar2 + lVar3),(void *)((long)ppMVar2 + lVar3 + 8),
                (ulong)(uVar1 - 1) * 8 - lVar3);
        break;
      }
      lVar3 = lVar3 + 8;
    } while ((ulong)uVar1 * 8 - lVar3 != 0);
  }
  uc->memory_region_update_pending = true;
  memory_region_transaction_commit_ppc(uc->system_memory);
  local_20->container = (MemoryRegion *)(long)uc->snapshot_level;
  return;
}

Assistant:

void memory_moveout(struct uc_struct *uc, MemoryRegion *mr)
{
    hwaddr addr;
    /* A bit dirty, but it works.
     * The first subregion will be the one with the smalest priority.
     * In case of CoW this will always be the region which is mapped initial and later be moved in the subregion of the container.
     * The initial subregion is the one stored in mapped_blocks
     * Because CoW is done after the snapshot level is increased there is only on subregion with 
     */
    memory_region_transaction_begin();
    MemoryRegion *mr_block = QTAILQ_FIRST(&mr->subregions);

    if (!mr_block) {
        mr_block = mr;
    }

    if (uc->cpu) {
        // We also need to remove all tb cache
        uc->uc_invalidate_tb(uc, mr->addr, int128_get64(mr->size));

        // Make sure all pages associated with the MemoryRegion are flushed
        // Only need to do this if we are in a running state
        for (addr = mr->addr; (int64_t)(mr->end - addr) > 0; addr += uc->target_page_size) {
           tlb_flush_page(uc->cpu, addr);
        }
    }

    memory_region_del_subregion(uc->system_memory, mr);
    g_array_append_val(uc->unmapped_regions, mr);
    memory_region_remove_mapped_block(uc, mr_block, false);
    uc->memory_region_update_pending = true;
    memory_region_transaction_commit(uc->system_memory);
    /* dirty hack to save the snapshot level */
    mr->container = (void *)(intptr_t)uc->snapshot_level;
}